

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditional_entropy.c
# Opt level: O2

double * inform_local_conditional_entropy
                   (int *xs,int *ys,size_t n,int bx,int by,double *ce,inform_error *err)

{
  inform_dist *piVar1;
  inform_dist *piVar2;
  _Bool _Var3;
  double *__ptr;
  size_t i;
  size_t sVar4;
  double dVar5;
  inform_dist *xy;
  inform_dist *x;
  inform_dist *local_40;
  inform_dist *local_38;
  
  _Var3 = check_arguments(xs,ys,n,bx,by,err);
  if (!_Var3) {
    __ptr = ce;
    if ((ce == (double *)0x0) && (__ptr = (double *)malloc(n * 8), __ptr == (double *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
    }
    else {
      local_38 = (inform_dist *)0x0;
      local_40 = (inform_dist *)0x0;
      _Var3 = allocate(bx,by,&local_38,&local_40,err);
      piVar2 = local_38;
      piVar1 = local_40;
      if (!_Var3) {
        accumulate(xs,ys,n,by,local_38,local_40);
        for (sVar4 = 0; n != sVar4; sVar4 = sVar4 + 1) {
          dVar5 = log2((double)piVar2->histogram[xs[sVar4]] /
                       (double)piVar1->histogram[(long)ys[sVar4] + (long)xs[sVar4] * (long)by]);
          __ptr[sVar4] = dVar5;
        }
        free_all(&local_38,&local_40);
        return __ptr;
      }
      if (ce == (double *)0x0) {
        free(__ptr);
      }
    }
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_conditional_entropy(int const *xs, int const *ys,
    size_t n, int bx, int by, double *ce, inform_error *err)
{
    if (check_arguments(xs, ys, n, bx, by, err)) return NULL;

    bool allocate_ce = (ce == NULL);
    if (allocate_ce)
    {
        ce = malloc(n * sizeof(double));
        if (ce == NULL)
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist *x = NULL, *xy = NULL;
    if (allocate(bx, by, &x, &xy, err))
    {
        if (allocate_ce) free(ce);
        return NULL;
    }

    accumulate(xs, ys, n, by, x, xy);

    double s, m;
    for (size_t i = 0; i < n; ++i)
    {
        int z = xs[i]*by + ys[i];
        s = xy->histogram[z];
        m = x->histogram[xs[i]];
        ce[i] = log2(m/s);
    }

    free_all(&x, &xy);

    return ce;
}